

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSynchronizationBasicEventTests.cpp
# Opt level: O2

TestStatus *
vkt::synchronization::anon_unknown_0::secondaryCommandBufferCase
          (TestStatus *__return_storage_ptr__,Context *context)

{
  deUint32 queueFamilyIndex;
  VkResult VVar1;
  int iVar2;
  DeviceInterface *vk;
  VkDevice device;
  long lVar3;
  allocator<char> local_1f1;
  VkQueue local_1f0;
  string local_1e8;
  RefBase<vk::Handle<(vk::HandleType)10>_> local_1c8;
  VkCommandBuffer secondaryCmdBuffers [2];
  RefBase<vk::Handle<(vk::HandleType)24>_> local_198;
  RefBase<vk::Handle<(vk::HandleType)6>_> local_178;
  Move<vk::VkCommandBuffer_s_*> primaryCmdBuffer;
  VkSubmitInfo submitInfo;
  Move<vk::VkCommandBuffer_s_*> prtCmdBuffers [2];
  VkCommandBufferBeginInfo cmdBufferBeginInfo;
  VkCommandBufferAllocateInfo cmdBufferInfo;
  undefined1 local_68 [24];
  VkAllocationCallbacks *pVStack_50;
  VkFramebuffer local_48;
  undefined8 uStack_40;
  VkQueryPipelineStatisticFlags local_38;
  
  vk = Context::getDeviceInterface(context);
  device = Context::getDevice(context);
  local_1f0 = Context::getUniversalQueue(context);
  queueFamilyIndex = Context::getUniversalQueueFamilyIndex(context);
  ::vk::createFence((Move<vk::Handle<(vk::HandleType)6>_> *)&submitInfo,vk,device,0,
                    (VkAllocationCallbacks *)0x0);
  local_178.m_data.deleter.m_device = (VkDevice)submitInfo._16_8_;
  local_178.m_data.deleter.m_allocator = (VkAllocationCallbacks *)submitInfo.pWaitSemaphores;
  local_178.m_data.object.m_internal = submitInfo._0_8_;
  local_178.m_data.deleter.m_deviceIface = (DeviceInterface *)submitInfo.pNext;
  submitInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  submitInfo._4_4_ = 0;
  submitInfo.pNext = (void *)0x0;
  submitInfo.waitSemaphoreCount = 0;
  submitInfo._20_4_ = 0;
  submitInfo.pWaitSemaphores = (VkSemaphore *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)6>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)6>_> *)&submitInfo);
  ::vk::createCommandPool
            ((Move<vk::Handle<(vk::HandleType)24>_> *)&submitInfo,vk,device,2,queueFamilyIndex,
             (VkAllocationCallbacks *)0x0);
  local_198.m_data.deleter.m_device = (VkDevice)submitInfo._16_8_;
  local_198.m_data.deleter.m_allocator = (VkAllocationCallbacks *)submitInfo.pWaitSemaphores;
  local_198.m_data.object.m_internal = submitInfo._0_8_;
  local_198.m_data.deleter.m_deviceIface = (DeviceInterface *)submitInfo.pNext;
  submitInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  submitInfo._4_4_ = 0;
  submitInfo.pNext = (void *)0x0;
  submitInfo.waitSemaphoreCount = 0;
  submitInfo._20_4_ = 0;
  submitInfo.pWaitSemaphores = (VkSemaphore *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)24>_> *)&submitInfo);
  makeCommandBuffer(&primaryCmdBuffer,vk,device,(VkCommandPool)local_198.m_data.object.m_internal);
  cmdBufferInfo.sType = VK_STRUCTURE_TYPE_COMMAND_BUFFER_ALLOCATE_INFO;
  cmdBufferInfo.pNext = (void *)0x0;
  cmdBufferInfo.commandPool.m_internal = local_198.m_data.object.m_internal;
  cmdBufferInfo.level = VK_COMMAND_BUFFER_LEVEL_SECONDARY;
  cmdBufferInfo.commandBufferCount = 1;
  ::vk::allocateCommandBuffer(prtCmdBuffers,vk,device,&cmdBufferInfo);
  ::vk::allocateCommandBuffer(prtCmdBuffers + 1,vk,device,&cmdBufferInfo);
  secondaryCmdBuffers[0] = prtCmdBuffers[0].super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object;
  secondaryCmdBuffers[1] = prtCmdBuffers[1].super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object;
  submitInfo.pNext = (void *)0x0;
  submitInfo.pWaitDstStageMask = (VkPipelineStageFlags *)0x0;
  submitInfo.signalSemaphoreCount = 0;
  submitInfo._60_4_ = 0;
  submitInfo.pSignalSemaphores = (VkSemaphore *)0x0;
  submitInfo.waitSemaphoreCount = 0;
  submitInfo._20_4_ = 0;
  submitInfo.pWaitSemaphores = (VkSemaphore *)0x0;
  submitInfo.sType = VK_STRUCTURE_TYPE_SUBMIT_INFO;
  submitInfo._4_4_ = 0;
  submitInfo.commandBufferCount = 1;
  submitInfo._44_4_ = 0;
  submitInfo.pCommandBuffers = (VkCommandBuffer *)&primaryCmdBuffer;
  ::vk::createEvent((Move<vk::Handle<(vk::HandleType)10>_> *)local_68,vk,device,0,
                    (VkAllocationCallbacks *)0x0);
  local_1c8.m_data.deleter.m_device = (VkDevice)local_68._16_8_;
  local_1c8.m_data.deleter.m_allocator = pVStack_50;
  local_1c8.m_data.object.m_internal = local_68._0_8_;
  local_1c8.m_data.deleter.m_deviceIface = (DeviceInterface *)local_68._8_8_;
  local_68._0_8_ = 0;
  local_68._8_8_ = (DeviceInterface *)0x0;
  local_68._16_8_ = (VkDevice)0x0;
  pVStack_50 = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)10>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)10>_> *)local_68);
  local_68._0_4_ = 0x29;
  local_68._8_8_ = (DeviceInterface *)0x0;
  local_68._16_8_ = (VkDevice)0x0;
  pVStack_50 = (VkAllocationCallbacks *)((ulong)pVStack_50 & 0xffffffff00000000);
  local_38 = 0;
  cmdBufferBeginInfo.sType = VK_STRUCTURE_TYPE_COMMAND_BUFFER_BEGIN_INFO;
  cmdBufferBeginInfo.pNext = (void *)0x0;
  local_48.m_internal = 0;
  uStack_40._0_4_ = 0;
  uStack_40._4_4_ = 0;
  cmdBufferBeginInfo.flags = 1;
  cmdBufferBeginInfo.pInheritanceInfo = (VkCommandBufferInheritanceInfo *)local_68;
  VVar1 = (*vk->_vptr_DeviceInterface[0x49])
                    (vk,prtCmdBuffers[0].super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object);
  ::vk::checkResult(VVar1,"vk.beginCommandBuffer(secondaryCmdBuffers[SET], &cmdBufferBeginInfo)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/synchronization/vktSynchronizationBasicEventTests.cpp"
                    ,0x144);
  (*vk->_vptr_DeviceInterface[0x6a])
            (vk,prtCmdBuffers[0].super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,
             local_1c8.m_data.object.m_internal,1);
  endCommandBuffer(vk,prtCmdBuffers[0].super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object);
  VVar1 = (*vk->_vptr_DeviceInterface[0x49])
                    (vk,prtCmdBuffers[1].super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,
                     &cmdBufferBeginInfo);
  ::vk::checkResult(VVar1,"vk.beginCommandBuffer(secondaryCmdBuffers[WAIT], &cmdBufferBeginInfo)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/synchronization/vktSynchronizationBasicEventTests.cpp"
                    ,0x148);
  (*vk->_vptr_DeviceInterface[0x6c])
            (vk,prtCmdBuffers[1].super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,1,&local_1c8,1
             ,0x10000,0,0,0,0,0,0);
  endCommandBuffer(vk,prtCmdBuffers[1].super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object);
  beginCommandBuffer(vk,primaryCmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object);
  (*vk->_vptr_DeviceInterface[0x77])
            (vk,primaryCmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,2,
             secondaryCmdBuffers);
  endCommandBuffer(vk,primaryCmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object);
  VVar1 = (*vk->_vptr_DeviceInterface[2])
                    (vk,local_1f0,1,&submitInfo,local_178.m_data.object.m_internal);
  ::vk::checkResult(VVar1,"vk.queueSubmit(queue, 1u, &submitInfo, *fence)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/synchronization/vktSynchronizationBasicEventTests.cpp"
                    ,0x150);
  iVar2 = (*vk->_vptr_DeviceInterface[0x16])(vk,device,1,&local_178,1,0xffffffffffffffff);
  if (iVar2 == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1e8,
               "Wait and set even on device using secondary command buffers tests pass",&local_1f1);
    tcu::TestStatus::pass(__return_storage_ptr__,&local_1e8);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1e8,"Queue should end execution",&local_1f1);
    tcu::TestStatus::fail(__return_storage_ptr__,&local_1e8);
  }
  std::__cxx11::string::~string((string *)&local_1e8);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)10>_>::~RefBase(&local_1c8);
  lVar3 = 0x20;
  do {
    ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::~RefBase
              ((RefBase<vk::VkCommandBuffer_s_*> *)
               ((long)&prtCmdBuffers[0].super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object + lVar3
               ));
    lVar3 = lVar3 + -0x20;
  } while (lVar3 != -0x20);
  ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::~RefBase
            (&primaryCmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::~RefBase(&local_198);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)6>_>::~RefBase(&local_178);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus secondaryCommandBufferCase (Context& context)
{
	enum {SET=0, WAIT, COUNT};
	const DeviceInterface&					vk						= context.getDeviceInterface();
	const VkDevice							device					= context.getDevice();
	const VkQueue							queue					= context.getUniversalQueue();
	const deUint32							queueFamilyIndex		= context.getUniversalQueueFamilyIndex();
	const Unique<VkFence>					fence					(createFence(vk, device));
	const Unique<VkCommandPool>				cmdPool					(createCommandPool(vk, device, VK_COMMAND_POOL_CREATE_RESET_COMMAND_BUFFER_BIT, queueFamilyIndex));
	const Move<VkCommandBuffer>				primaryCmdBuffer		(makeCommandBuffer(vk, device, *cmdPool));
	const VkCommandBufferAllocateInfo		cmdBufferInfo			=
																	{
																		VK_STRUCTURE_TYPE_COMMAND_BUFFER_ALLOCATE_INFO,		// VkStructureType		sType;
																		DE_NULL,											// const void*			pNext;
																		*cmdPool,											// VkCommandPool		commandPool;
																		VK_COMMAND_BUFFER_LEVEL_SECONDARY,					// VkCommandBufferLevel	level;
																		1u,													// deUint32				commandBufferCount;
																	};
	const Move<VkCommandBuffer>				prtCmdBuffers[COUNT]	= {allocateCommandBuffer (vk, device, &cmdBufferInfo), allocateCommandBuffer (vk, device, &cmdBufferInfo)};
	VkCommandBuffer							secondaryCmdBuffers[]	= {*prtCmdBuffers[SET], *prtCmdBuffers[WAIT]};
	const VkSubmitInfo						submitInfo				=
																	{
																		VK_STRUCTURE_TYPE_SUBMIT_INFO,	// VkStructureType				sType;
																		DE_NULL,						// const void*					pNext;
																		0u,								// deUint32						waitSemaphoreCount;
																		DE_NULL,						// const VkSemaphore*			pWaitSemaphores;
																		DE_NULL,						// const VkPipelineStageFlags*	pWaitDstStageMask;
																		1u,								// deUint32						commandBufferCount;
																		&primaryCmdBuffer.get(),		// const VkCommandBuffer*		pCommandBuffers;
																		0u,								// deUint32						signalSemaphoreCount;
																		DE_NULL,						// const VkSemaphore*			pSignalSemaphores;
																	};
	const Unique<VkEvent>					event					(createEvent(vk, device));

	const VkCommandBufferInheritanceInfo	secCmdBufInheritInfo	=
																	{
																		VK_STRUCTURE_TYPE_COMMAND_BUFFER_INHERITANCE_INFO,	//VkStructureType					sType;
																		DE_NULL,											//const void*						pNext;
																		DE_NULL,											//VkRenderPass					renderPass;
																		0u,													//deUint32						subpass;
																		DE_NULL,											//VkFramebuffer					framebuffer;
																		VK_FALSE,											//VkBool32						occlusionQueryEnable;
																		(VkQueryControlFlags)0u,							//VkQueryControlFlags				queryFlags;
																		(VkQueryPipelineStatisticFlags)0u,					//VkQueryPipelineStatisticFlags	pipelineStatistics;
																	};
	const VkCommandBufferBeginInfo			cmdBufferBeginInfo		=
																	{
																		VK_STRUCTURE_TYPE_COMMAND_BUFFER_BEGIN_INFO,	// VkStructureType                          sType;
																		DE_NULL,										// const void*                              pNext;
																		VK_COMMAND_BUFFER_USAGE_ONE_TIME_SUBMIT_BIT,	// VkCommandBufferUsageFlags                flags;
																		&secCmdBufInheritInfo,							// const VkCommandBufferInheritanceInfo*    pInheritanceInfo;
																	};

	VK_CHECK(vk.beginCommandBuffer(secondaryCmdBuffers[SET], &cmdBufferBeginInfo));
	vk.cmdSetEvent(secondaryCmdBuffers[SET], *event, VK_PIPELINE_STAGE_TOP_OF_PIPE_BIT);
	endCommandBuffer(vk, secondaryCmdBuffers[SET]);

	VK_CHECK(vk.beginCommandBuffer(secondaryCmdBuffers[WAIT], &cmdBufferBeginInfo));
	vk.cmdWaitEvents(secondaryCmdBuffers[WAIT], 1u, &event.get(),VK_PIPELINE_STAGE_TOP_OF_PIPE_BIT, VK_PIPELINE_STAGE_ALL_COMMANDS_BIT, 0u, DE_NULL, 0u, DE_NULL, 0u, DE_NULL);
	endCommandBuffer(vk, secondaryCmdBuffers[WAIT]);

	beginCommandBuffer(vk, *primaryCmdBuffer);
	vk.cmdExecuteCommands(*primaryCmdBuffer, 2u, secondaryCmdBuffers);
	endCommandBuffer(vk, *primaryCmdBuffer);

	VK_CHECK(vk.queueSubmit(queue, 1u, &submitInfo, *fence));
	if (VK_SUCCESS != vk.waitForFences(device, 1u, &fence.get(), DE_TRUE, LONG_FENCE_WAIT))
		return tcu::TestStatus::fail("Queue should end execution");

	return tcu::TestStatus::pass("Wait and set even on device using secondary command buffers tests pass");
}